

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::MatteMaterial::writeTo(MatteMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  int32_t local_4c;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_28,&(this->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_4c = BinaryWriter::serialize(binary,(SP *)local_28);
  BinaryWriter::write<int>(binary,&local_4c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->kd);
  BinaryWriter::write<float>(binary,&this->sigma);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_38,&(this->map_sigma).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_4c = BinaryWriter::serialize(binary,(SP *)local_38);
  BinaryWriter::write<int>(binary,&local_4c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_48,&(this->map_bump).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_4c = BinaryWriter::serialize(binary,(SP *)local_48);
  BinaryWriter::write<int>(binary,&local_4c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  return 0x10;
}

Assistant:

int MatteMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(binary.serialize(map_kd));
    binary.write(kd);
    binary.write(sigma);
    binary.write(binary.serialize(map_sigma));
    binary.write(binary.serialize(map_bump));
    return TYPE_MATTE_MATERIAL;
  }